

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_game.cc
# Opt level: O2

HanabiMove __thiscall
hanabi_learning_env::HanabiGame::ConstructChanceOutcome(HanabiGame *this,int uid)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar2 = 0xff00ffff00000000;
  uVar4 = 0xff000000000000;
  if (-1 < uid) {
    iVar1 = this->num_ranks_;
    if (uid < iVar1 * this->num_colors_) {
      uVar2 = (long)uid / (long)iVar1;
      uVar4 = ((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) %
               (long)this->num_colors_ & 0xffU) << 0x30;
      uVar2 = (long)uid % (long)iVar1 << 0x38 | 0xffff00000000;
      uVar3 = 5;
      goto LAB_00115303;
    }
  }
  uVar3 = 0;
LAB_00115303:
  return (HanabiMove)(uVar2 | uVar4 | uVar3);
}

Assistant:

HanabiMove HanabiGame::ConstructChanceOutcome(int uid) const {
  if (uid < 0 || uid >= MaxChanceOutcomes()) {
    return HanabiMove(HanabiMove::kInvalid, /*card_index=*/-1,
                      /*target_offset=*/-1, /*color=*/-1, /*rank=*/-1);
  }
  return HanabiMove(HanabiMove::kDeal, /*card_index=*/-1,
                    /*target_offset=*/-1,
                    /*color=*/uid / NumRanks() % NumColors(),
                    /*rank=*/uid % NumRanks());
}